

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::blend_equation_advanced
               (NegativeTestContext *ctx)

{
  NegativeTestContext *ctx_00;
  ostream *poVar1;
  string local_1e0;
  ostringstream local_1c0 [8];
  ostringstream source;
  int local_48;
  int ndx;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "GL_KHR_blend_equation_advanced features require enabling the extension in 310 es shaders."
             ,&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  for (local_48 = 0; local_48 < 0xf; local_48 = local_48 + 1) {
    std::__cxx11::ostringstream::ostringstream(local_1c0);
    poVar1 = std::operator<<((ostream *)local_1c0,"#version 310 es\nlayout(");
    poVar1 = std::operator<<(poVar1,blend_equation_advanced::s_qualifiers[local_48]);
    std::operator<<(poVar1,") out;\nvoid main()\n{\n}\n");
    ctx_00 = local_10;
    std::__cxx11::ostringstream::str();
    verifyShader(ctx_00,SHADERTYPE_FRAGMENT,&local_1e0,EXPECT_RESULT_FAIL);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::ostringstream::~ostringstream(local_1c0);
  }
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void blend_equation_advanced (NegativeTestContext& ctx)
{
	static const char* const s_qualifiers[] =
	{
		"blend_support_multiply",
		"blend_support_screen",
		"blend_support_overlay",
		"blend_support_darken",
		"blend_support_lighten",
		"blend_support_colordodge",
		"blend_support_colorburn",
		"blend_support_hardlight",
		"blend_support_softlight",
		"blend_support_difference",
		"blend_support_exclusion",
		"blend_support_hsl_hue",
		"blend_support_hsl_saturation",
		"blend_support_hsl_color",
		"blend_support_hsl_luminosity",
	};

	ctx.beginSection("GL_KHR_blend_equation_advanced features require enabling the extension in 310 es shaders.");
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_qualifiers); ++ndx)
	{
		std::ostringstream source;
		source <<	"#version 310 es\n"
					"layout(" << s_qualifiers[ndx] << ") out;\n"
					"void main()\n"
					"{\n"
					"}\n";
		verifyShader(ctx, glu::SHADERTYPE_FRAGMENT, source.str(), EXPECT_RESULT_FAIL);
	}
	ctx.endSection();
}